

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

string * __thiscall
CppUnit::Message::detailAt_abi_cxx11_(string *__return_storage_ptr__,Message *this,int index)

{
  _Map_pointer ppbVar1;
  _Map_pointer ppbVar2;
  _Elt_pointer pbVar3;
  pointer pcVar4;
  invalid_argument *this_00;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong uVar7;
  
  if (index < 0) {
LAB_00122691:
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Message::detailAt() : invalid index");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  ppbVar1 = (this->m_details).
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppbVar2 = (this->m_details).
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar3 = (this->m_details).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((int)((int)((ulong)((long)(this->m_details).
                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pbVar3) >>
                 5) + (int)((ulong)((long)(this->m_details).
                                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                   (long)(this->m_details).
                                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
           ((((uint)((int)ppbVar1 - (int)ppbVar2) >> 3) - 1) + (uint)(ppbVar1 == (_Map_pointer)0x0))
           * 0x10) <= index) goto LAB_00122691;
  uVar5 = ((long)pbVar3 -
           (long)(this->m_details).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 5) + (ulong)(uint)index;
  if ((long)uVar5 < 0) {
    uVar7 = (long)uVar5 >> 4;
  }
  else {
    if (uVar5 < 0x10) {
      pbVar6 = pbVar3 + (uint)index;
      goto LAB_0012266d;
    }
    uVar7 = uVar5 >> 4;
  }
  pbVar6 = ppbVar2[uVar7] + uVar5 + uVar7 * -0x10;
LAB_0012266d:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = (pbVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar4,pcVar4 + pbVar6->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string 
Message::detailAt( int index ) const
{
  if ( index < 0  ||  index >= detailCount() )
    throw std::invalid_argument( "Message::detailAt() : invalid index" );

  return m_details[ index ];
}